

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS ref_collapse_post_uv_area(REF_GRID ref_grid,REF_INT node)

{
  REF_CELL ref_cell_00;
  REF_GEOM ref_geom_00;
  REF_NODE ref_node_00;
  uint uVar1;
  REF_INT local_ec;
  REF_INT local_e8;
  int local_e4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL area;
  REF_DBL uv_area;
  REF_DBL sign_uv_area;
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[3];
  ref_geom_00 = ref_grid->geom;
  ref_node_00 = ref_grid->node;
  if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
    local_e4 = -1;
  }
  else {
    local_e4 = ref_cell_00->ref_adj->first[node];
  }
  local_3c = local_e4;
  if (local_e4 == -1) {
    local_e8 = -1;
  }
  else {
    local_e8 = ref_cell_00->ref_adj->item[local_e4].ref;
  }
  local_40 = local_e8;
  while( true ) {
    if (local_3c == -1) {
      return 0;
    }
    uVar1 = ref_cell_nodes(ref_cell_00,local_40,(REF_INT *)&sign_uv_area);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x48,"ref_collapse_post_uv_area",(ulong)uVar1,"cell nodes");
      return uVar1;
    }
    uVar1 = ref_node_tri_area(ref_node_00,(REF_INT *)&sign_uv_area,
                              (REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x49,"ref_collapse_post_uv_area",(ulong)uVar1,"vol");
      return uVar1;
    }
    uVar1 = ref_geom_uv_area(ref_geom_00,(REF_INT *)&sign_uv_area,&area);
    if (uVar1 != 0) break;
    uVar1 = ref_geom_uv_area_sign(ref_grid,nodes[1],&uv_area);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x4b,"ref_collapse_post_uv_area",(ulong)uVar1,"sign");
      return uVar1;
    }
    area = uv_area * area;
    if (area < 1e-20) {
      printf("area %e uv area %e bool %d\n",_ref_private_macro_code_rss_1,area,
             (ulong)(area < ref_node_00->min_uv_area));
      return 1;
    }
    local_3c = ref_cell_00->ref_adj->item[local_3c].next;
    if (local_3c == -1) {
      local_ec = -1;
    }
    else {
      local_ec = ref_cell_00->ref_adj->item[local_3c].ref;
    }
    local_40 = local_ec;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x4a,
         "ref_collapse_post_uv_area",(ulong)uVar1,"uv area");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_post_uv_area(REF_GRID ref_grid, REF_INT node) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL sign_uv_area, uv_area, area;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
    RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
    RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
    uv_area *= sign_uv_area;
    if (uv_area < 1.0e-20) {
      printf("area %e uv area %e bool %d\n", area, uv_area,
             uv_area < ref_node_min_uv_area(ref_node));
      return REF_FAILURE;
    }
  }
  return REF_SUCCESS;
}